

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall cmake::ActualConfigure(cmake *this)

{
  cmState *pcVar1;
  pointer pcVar2;
  size_t sVar3;
  cmFileAPI *__ptr;
  cmMakefile *this_00;
  undefined1 *puVar4;
  bool bVar5;
  int iVar6;
  string *psVar7;
  string *psVar8;
  cmGlobalGenerator *pcVar9;
  cmFileAPI *this_01;
  char *pcVar10;
  pointer __p;
  string fullName;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  string local_50;
  
  UpdateConversionPathTable(this);
  CleanupCommandsAndMacros(this);
  iVar6 = DoPreConfigureChecks(this);
  if (iVar6 < 0) {
    return -2;
  }
  if (iVar6 == 0) {
    local_70._0_8_ = (cmGlobalGenerator *)local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"CMAKE_HOME_DIRECTORY","");
    psVar7 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
    AddCacheEntry(this,(string *)local_70,(psVar7->_M_dataplus)._M_p,
                  "Source directory with the top level CMakeLists.txt file for this project",4);
    if ((cmGlobalGenerator *)local_70._0_8_ != (cmGlobalGenerator *)local_60) {
      operator_delete((void *)local_70._0_8_,local_60._0_8_ + 1);
    }
  }
  if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
    pcVar1 = this->State;
    local_70._0_8_ = (cmGlobalGenerator *)local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"CMAKE_GENERATOR","");
    psVar7 = cmState::GetInitializedCacheValue(pcVar1,(string *)local_70);
    if ((cmGlobalGenerator *)local_70._0_8_ != (cmGlobalGenerator *)local_60) {
      operator_delete((void *)local_70._0_8_,local_60._0_8_ + 1);
    }
    pcVar1 = this->State;
    local_70._0_8_ = (cmGlobalGenerator *)local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"CMAKE_EXTRA_GENERATOR","");
    psVar8 = cmState::GetInitializedCacheValue(pcVar1,(string *)local_70);
    if ((cmGlobalGenerator *)local_70._0_8_ != (cmGlobalGenerator *)local_60) {
      operator_delete((void *)local_70._0_8_,local_60._0_8_ + 1);
    }
    if (psVar7 != (string *)0x0) {
      puVar4 = (undefined1 *)&local_50.field_2;
      local_50._M_dataplus._M_p = puVar4;
      if (psVar8 == (string *)0x0) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
      }
      else {
        pcVar2 = (psVar8->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + psVar8->_M_string_length);
      }
      cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                ((string *)local_70,psVar7,&local_50);
      if (local_50._M_dataplus._M_p != puVar4) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pcVar9 = CreateGlobalGenerator(this,(string *)local_70);
      this->GlobalGenerator = pcVar9;
      if ((cmGlobalGenerator *)local_70._0_8_ != (cmGlobalGenerator *)local_60) {
        operator_delete((void *)local_70._0_8_,local_60._0_8_ + 1);
      }
    }
    if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
      EvaluateDefaultGlobalGenerator((cmake *)local_70);
      SetGlobalGenerator(this,(cmGlobalGenerator *)local_70._0_8_);
      if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
        cmSystemTools::Error("Could not create generator",(char *)0x0,(char *)0x0,(char *)0x0);
        return -1;
      }
    }
    else {
      cmSystemTools::s_ForceUnixPaths = this->GlobalGenerator->ForceUnixPaths;
    }
  }
  pcVar1 = this->State;
  local_70._0_8_ = (cmGlobalGenerator *)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"CMAKE_GENERATOR","");
  psVar7 = cmState::GetInitializedCacheValue(pcVar1,(string *)local_70);
  if ((cmGlobalGenerator *)local_70._0_8_ != (cmGlobalGenerator *)local_60) {
    operator_delete((void *)local_70._0_8_,local_60._0_8_ + 1);
  }
  if ((psVar7 != (string *)0x0) &&
     (iVar6 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[4])(this->GlobalGenerator,psVar7),
     (char)iVar6 == '\0')) {
    local_70._0_8_ = (cmGlobalGenerator *)local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Error: generator : ","");
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_50);
    std::__cxx11::string::_M_append(local_70,(ulong)local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append(local_70);
    std::__cxx11::string::_M_append(local_70,(ulong)(psVar7->_M_dataplus)._M_p);
    std::__cxx11::string::append(local_70);
    cmSystemTools::Error((string *)local_70);
LAB_001bb169:
    if ((cmGlobalGenerator *)local_70._0_8_ != (cmGlobalGenerator *)local_60) {
      operator_delete((void *)local_70._0_8_,local_60._0_8_ + 1);
      return -2;
    }
    return -2;
  }
  pcVar1 = this->State;
  local_70._0_8_ = (cmGlobalGenerator *)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"CMAKE_GENERATOR","");
  psVar7 = cmState::GetInitializedCacheValue(pcVar1,(string *)local_70);
  if ((cmGlobalGenerator *)local_70._0_8_ != (cmGlobalGenerator *)local_60) {
    operator_delete((void *)local_70._0_8_,local_60._0_8_ + 1);
  }
  if (psVar7 == (string *)0x0) {
    local_70._0_8_ = (cmGlobalGenerator *)local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"CMAKE_GENERATOR","");
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_50);
    AddCacheEntry(this,(string *)local_70,local_50._M_dataplus._M_p,"Name of generator.",4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((cmGlobalGenerator *)local_70._0_8_ != (cmGlobalGenerator *)local_60) {
      operator_delete((void *)local_70._0_8_,local_60._0_8_ + 1);
    }
    local_70._0_8_ = (cmGlobalGenerator *)local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"CMAKE_EXTRA_GENERATOR","");
    cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_(&local_50,this->GlobalGenerator);
    AddCacheEntry(this,(string *)local_70,local_50._M_dataplus._M_p,
                  "Name of external makefile project generator.",4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((cmGlobalGenerator *)local_70._0_8_ != (cmGlobalGenerator *)local_60) {
      operator_delete((void *)local_70._0_8_,local_60._0_8_ + 1);
    }
  }
  pcVar1 = this->State;
  local_70._0_8_ = (cmGlobalGenerator *)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"CMAKE_GENERATOR_INSTANCE","");
  psVar7 = cmState::GetInitializedCacheValue(pcVar1,(string *)local_70);
  if ((cmGlobalGenerator *)local_70._0_8_ != (cmGlobalGenerator *)local_60) {
    operator_delete((void *)local_70._0_8_,local_60._0_8_ + 1);
  }
  if (psVar7 == (string *)0x0) {
    local_70._0_8_ = (cmGlobalGenerator *)local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"CMAKE_GENERATOR_INSTANCE","");
    AddCacheEntry(this,(string *)local_70,(this->GeneratorInstance)._M_dataplus._M_p,
                  "Generator instance identifier.",4);
    if ((cmGlobalGenerator *)local_70._0_8_ != (cmGlobalGenerator *)local_60) {
      operator_delete((void *)local_70._0_8_,local_60._0_8_ + 1);
    }
  }
  else {
    sVar3 = (this->GeneratorInstance)._M_string_length;
    if ((sVar3 != 0) &&
       ((sVar3 != psVar7->_M_string_length ||
        (iVar6 = bcmp((this->GeneratorInstance)._M_dataplus._M_p,(psVar7->_M_dataplus)._M_p,sVar3),
        iVar6 != 0)))) {
      local_70._0_8_ = (cmGlobalGenerator *)local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,"Error: generator instance: ","");
      std::__cxx11::string::_M_append(local_70,(ulong)(this->GeneratorInstance)._M_dataplus._M_p);
      std::__cxx11::string::append(local_70);
      std::__cxx11::string::_M_append(local_70,(ulong)(psVar7->_M_dataplus)._M_p);
      std::__cxx11::string::append(local_70);
      cmSystemTools::Error((string *)local_70);
      goto LAB_001bb169;
    }
  }
  pcVar1 = this->State;
  local_70._0_8_ = (cmGlobalGenerator *)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"CMAKE_GENERATOR_PLATFORM","");
  psVar7 = cmState::GetInitializedCacheValue(pcVar1,(string *)local_70);
  if ((cmGlobalGenerator *)local_70._0_8_ != (cmGlobalGenerator *)local_60) {
    operator_delete((void *)local_70._0_8_,local_60._0_8_ + 1);
  }
  if (psVar7 == (string *)0x0) {
    local_70._0_8_ = (cmGlobalGenerator *)local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"CMAKE_GENERATOR_PLATFORM","");
    AddCacheEntry(this,(string *)local_70,(this->GeneratorPlatform)._M_dataplus._M_p,
                  "Name of generator platform.",4);
    if ((cmGlobalGenerator *)local_70._0_8_ != (cmGlobalGenerator *)local_60) {
      operator_delete((void *)local_70._0_8_,local_60._0_8_ + 1);
    }
  }
  else {
    sVar3 = (this->GeneratorPlatform)._M_string_length;
    if ((sVar3 != 0) &&
       ((sVar3 != psVar7->_M_string_length ||
        (iVar6 = bcmp((this->GeneratorPlatform)._M_dataplus._M_p,(psVar7->_M_dataplus)._M_p,sVar3),
        iVar6 != 0)))) {
      local_70._0_8_ = (cmGlobalGenerator *)local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,"Error: generator platform: ","");
      std::__cxx11::string::_M_append(local_70,(ulong)(this->GeneratorPlatform)._M_dataplus._M_p);
      std::__cxx11::string::append(local_70);
      std::__cxx11::string::_M_append(local_70,(ulong)(psVar7->_M_dataplus)._M_p);
      std::__cxx11::string::append(local_70);
      cmSystemTools::Error((string *)local_70);
      goto LAB_001bb169;
    }
  }
  pcVar1 = this->State;
  local_70._0_8_ = (cmGlobalGenerator *)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"CMAKE_GENERATOR_TOOLSET","");
  psVar7 = cmState::GetInitializedCacheValue(pcVar1,(string *)local_70);
  if ((cmGlobalGenerator *)local_70._0_8_ != (cmGlobalGenerator *)local_60) {
    operator_delete((void *)local_70._0_8_,local_60._0_8_ + 1);
  }
  if (psVar7 == (string *)0x0) {
    local_70._0_8_ = (cmGlobalGenerator *)local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"CMAKE_GENERATOR_TOOLSET","")
    ;
    AddCacheEntry(this,(string *)local_70,(this->GeneratorToolset)._M_dataplus._M_p,
                  "Name of generator toolset.",4);
    if ((cmGlobalGenerator *)local_70._0_8_ != (cmGlobalGenerator *)local_60) {
      operator_delete((void *)local_70._0_8_,local_60._0_8_ + 1);
    }
  }
  else {
    sVar3 = (this->GeneratorToolset)._M_string_length;
    if ((sVar3 != 0) &&
       ((sVar3 != psVar7->_M_string_length ||
        (iVar6 = bcmp((this->GeneratorToolset)._M_dataplus._M_p,(psVar7->_M_dataplus)._M_p,sVar3),
        iVar6 != 0)))) {
      local_70._0_8_ = (cmGlobalGenerator *)local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,"Error: generator toolset: ","");
      std::__cxx11::string::_M_append(local_70,(ulong)(this->GeneratorToolset)._M_dataplus._M_p);
      std::__cxx11::string::append(local_70);
      std::__cxx11::string::_M_append(local_70,(ulong)(psVar7->_M_dataplus)._M_p);
      std::__cxx11::string::append(local_70);
      cmSystemTools::Error((string *)local_70);
      goto LAB_001bb169;
    }
  }
  bVar5 = cmState::GetIsInTryCompile(this->State);
  if (!bVar5) {
    cmGlobalGenerator::ClearEnabledLanguages(this->GlobalGenerator);
    TruncateOutputLog(this,"CMakeOutput.log");
    TruncateOutputLog(this,"CMakeError.log");
  }
  this_01 = (cmFileAPI *)operator_new(0x108);
  cmFileAPI::cmFileAPI(this_01,this);
  local_70._0_8_ = (cmFileAPI *)0x0;
  __ptr = (this->FileAPI)._M_t.super___uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>.
          _M_t.super__Tuple_impl<0UL,_cmFileAPI_*,_std::default_delete<cmFileAPI>_>.
          super__Head_base<0UL,_cmFileAPI_*,_false>._M_head_impl;
  (this->FileAPI)._M_t.super___uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>._M_t.
  super__Tuple_impl<0UL,_cmFileAPI_*,_std::default_delete<cmFileAPI>_>.
  super__Head_base<0UL,_cmFileAPI_*,_false>._M_head_impl = this_01;
  if ((__ptr != (cmFileAPI *)0x0) &&
     (std::default_delete<cmFileAPI>::operator()((default_delete<cmFileAPI> *)&this->FileAPI,__ptr),
     (cmFileAPI *)local_70._0_8_ != (cmFileAPI *)0x0)) {
    std::default_delete<cmFileAPI>::operator()
              ((default_delete<cmFileAPI> *)local_70,(cmFileAPI *)local_70._0_8_);
  }
  cmFileAPI::ReadQueries
            ((this->FileAPI)._M_t.super___uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>.
             _M_t.super__Tuple_impl<0UL,_cmFileAPI_*,_std::default_delete<cmFileAPI>_>.
             super__Head_base<0UL,_cmFileAPI_*,_false>._M_head_impl);
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0xb])();
  pcVar1 = this->State;
  local_70._0_8_ = (cmGlobalGenerator *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"CMAKE_BACKWARDS_COMPATIBILITY","");
  psVar7 = cmState::GetInitializedCacheValue(pcVar1,(string *)local_70);
  if ((cmGlobalGenerator *)local_70._0_8_ != (cmGlobalGenerator *)local_60) {
    operator_delete((void *)local_70._0_8_,local_60._0_8_ + 1);
  }
  if (psVar7 != (string *)0x0) {
    pcVar1 = this->State;
    local_70._0_8_ = (cmGlobalGenerator *)local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"LIBRARY_OUTPUT_PATH","");
    psVar7 = cmState::GetInitializedCacheValue(pcVar1,(string *)local_70);
    if ((cmGlobalGenerator *)local_70._0_8_ != (cmGlobalGenerator *)local_60) {
      operator_delete((void *)local_70._0_8_,local_60._0_8_ + 1);
    }
    if (psVar7 == (string *)0x0) {
      local_70._0_8_ = (cmGlobalGenerator *)local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"LIBRARY_OUTPUT_PATH","");
      AddCacheEntry(this,(string *)local_70,"","Single output directory for building all libraries."
                    ,1);
      if ((cmGlobalGenerator *)local_70._0_8_ != (cmGlobalGenerator *)local_60) {
        operator_delete((void *)local_70._0_8_,local_60._0_8_ + 1);
      }
    }
    pcVar1 = this->State;
    local_70._0_8_ = (cmGlobalGenerator *)local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"EXECUTABLE_OUTPUT_PATH","");
    psVar7 = cmState::GetInitializedCacheValue(pcVar1,(string *)local_70);
    if ((cmGlobalGenerator *)local_70._0_8_ != (cmGlobalGenerator *)local_60) {
      operator_delete((void *)local_70._0_8_,local_60._0_8_ + 1);
    }
    if (psVar7 == (string *)0x0) {
      local_70._0_8_ = (cmGlobalGenerator *)local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,"EXECUTABLE_OUTPUT_PATH","");
      AddCacheEntry(this,(string *)local_70,"",
                    "Single output directory for building all executables.",1);
      if ((cmGlobalGenerator *)local_70._0_8_ != (cmGlobalGenerator *)local_60) {
        operator_delete((void *)local_70._0_8_,local_60._0_8_ + 1);
      }
    }
  }
  this_00 = *(this->GlobalGenerator->Makefiles).
             super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_70._0_8_ = (cmGlobalGenerator *)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"CTEST_USE_LAUNCHERS","");
  bVar5 = cmMakefile::IsOn(this_00,(string *)local_70);
  if (bVar5) {
    pcVar1 = this->State;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"RULE_LAUNCH_COMPILE","");
    pcVar10 = cmState::GetGlobalProperty(pcVar1,&local_50);
    bVar5 = pcVar10 == (char *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar5 = false;
  }
  if ((cmGlobalGenerator *)local_70._0_8_ != (cmGlobalGenerator *)local_60) {
    operator_delete((void *)local_70._0_8_,local_60._0_8_ + 1);
  }
  if (bVar5) {
    cmSystemTools::Error
              ("CTEST_USE_LAUNCHERS is enabled, but the RULE_LAUNCH_COMPILE global property is not defined.\nDid you forget to include(CTest) in the toplevel CMakeLists.txt ?"
               ,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  pcVar1 = this->State;
  psVar7 = cmState::GetBinaryDirectory_abi_cxx11_(pcVar1);
  cmState::SaveVerificationScript(pcVar1,psVar7);
  psVar7 = cmState::GetBinaryDirectory_abi_cxx11_(this->State);
  SaveCache(this,psVar7);
  if (((cmSystemTools::s_ErrorOccured == false) && (cmSystemTools::s_FatalErrorOccured == false)) &&
     (bVar5 = cmSystemTools::GetInterruptFlag(), !bVar5)) {
    return 0;
  }
  return -1;
}

Assistant:

int cmake::ActualConfigure()
{
  // Construct right now our path conversion table before it's too late:
  this->UpdateConversionPathTable();
  this->CleanupCommandsAndMacros();

  int res = this->DoPreConfigureChecks();
  if (res < 0) {
    return -2;
  }
  if (!res) {
    this->AddCacheEntry(
      "CMAKE_HOME_DIRECTORY", this->GetHomeDirectory().c_str(),
      "Source directory with the top level CMakeLists.txt file for this "
      "project",
      cmStateEnums::INTERNAL);
  }

  // no generator specified on the command line
  if (!this->GlobalGenerator) {
    const std::string* genName =
      this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
    const std::string* extraGenName =
      this->State->GetInitializedCacheValue("CMAKE_EXTRA_GENERATOR");
    if (genName) {
      std::string fullName =
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
          *genName, extraGenName ? *extraGenName : "");
      this->GlobalGenerator = this->CreateGlobalGenerator(fullName);
    }
    if (this->GlobalGenerator) {
      // set the global flag for unix style paths on cmSystemTools as
      // soon as the generator is set.  This allows gmake to be used
      // on windows.
      cmSystemTools::SetForceUnixPaths(
        this->GlobalGenerator->GetForceUnixPaths());
    } else {
      this->CreateDefaultGlobalGenerator();
    }
    if (!this->GlobalGenerator) {
      cmSystemTools::Error("Could not create generator");
      return -1;
    }
  }

  const std::string* genName =
    this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
  if (genName) {
    if (!this->GlobalGenerator->MatchesGeneratorName(*genName)) {
      std::string message = "Error: generator : ";
      message += this->GlobalGenerator->GetName();
      message += "\nDoes not match the generator used previously: ";
      message += *genName;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message);
      return -2;
    }
  }
  if (!this->State->GetInitializedCacheValue("CMAKE_GENERATOR")) {
    this->AddCacheEntry("CMAKE_GENERATOR",
                        this->GlobalGenerator->GetName().c_str(),
                        "Name of generator.", cmStateEnums::INTERNAL);
    this->AddCacheEntry("CMAKE_EXTRA_GENERATOR",
                        this->GlobalGenerator->GetExtraGeneratorName().c_str(),
                        "Name of external makefile project generator.",
                        cmStateEnums::INTERNAL);
  }

  if (const std::string* instance =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_INSTANCE")) {
    if (!this->GeneratorInstance.empty() &&
        this->GeneratorInstance != *instance) {
      std::string message = "Error: generator instance: ";
      message += this->GeneratorInstance;
      message += "\nDoes not match the instance used previously: ";
      message += *instance;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry(
      "CMAKE_GENERATOR_INSTANCE", this->GeneratorInstance.c_str(),
      "Generator instance identifier.", cmStateEnums::INTERNAL);
  }

  if (const std::string* platformName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_PLATFORM")) {
    if (!this->GeneratorPlatform.empty() &&
        this->GeneratorPlatform != *platformName) {
      std::string message = "Error: generator platform: ";
      message += this->GeneratorPlatform;
      message += "\nDoes not match the platform used previously: ";
      message += *platformName;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_PLATFORM",
                        this->GeneratorPlatform.c_str(),
                        "Name of generator platform.", cmStateEnums::INTERNAL);
  }

  if (const std::string* tsName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_TOOLSET")) {
    if (!this->GeneratorToolset.empty() && this->GeneratorToolset != *tsName) {
      std::string message = "Error: generator toolset: ";
      message += this->GeneratorToolset;
      message += "\nDoes not match the toolset used previously: ";
      message += *tsName;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_TOOLSET",
                        this->GeneratorToolset.c_str(),
                        "Name of generator toolset.", cmStateEnums::INTERNAL);
  }

  // reset any system configuration information, except for when we are
  // InTryCompile. With TryCompile the system info is taken from the parent's
  // info to save time
  if (!this->State->GetIsInTryCompile()) {
    this->GlobalGenerator->ClearEnabledLanguages();

    this->TruncateOutputLog("CMakeOutput.log");
    this->TruncateOutputLog("CMakeError.log");
  }

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->FileAPI = cm::make_unique<cmFileAPI>(this);
  this->FileAPI->ReadQueries();
#endif

  // actually do the configure
  this->GlobalGenerator->Configure();
  // Before saving the cache
  // if the project did not define one of the entries below, add them now
  // so users can edit the values in the cache:

  // We used to always present LIBRARY_OUTPUT_PATH and
  // EXECUTABLE_OUTPUT_PATH.  They are now documented as old-style and
  // should no longer be used.  Therefore we present them only if the
  // project requires compatibility with CMake 2.4.  We detect this
  // here by looking for the old CMAKE_BACKWARDS_COMPATIBILITY
  // variable created when CMP0001 is not set to NEW.
  if (this->State->GetInitializedCacheValue("CMAKE_BACKWARDS_COMPATIBILITY")) {
    if (!this->State->GetInitializedCacheValue("LIBRARY_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "LIBRARY_OUTPUT_PATH", "",
        "Single output directory for building all libraries.",
        cmStateEnums::PATH);
    }
    if (!this->State->GetInitializedCacheValue("EXECUTABLE_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "EXECUTABLE_OUTPUT_PATH", "",
        "Single output directory for building all executables.",
        cmStateEnums::PATH);
    }
  }

  cmMakefile* mf = this->GlobalGenerator->GetMakefiles()[0];
  if (mf->IsOn("CTEST_USE_LAUNCHERS") &&
      !this->State->GetGlobalProperty("RULE_LAUNCH_COMPILE")) {
    cmSystemTools::Error(
      "CTEST_USE_LAUNCHERS is enabled, but the "
      "RULE_LAUNCH_COMPILE global property is not defined.\n"
      "Did you forget to include(CTest) in the toplevel "
      "CMakeLists.txt ?");
  }

  this->State->SaveVerificationScript(this->GetHomeOutputDirectory());
  this->SaveCache(this->GetHomeOutputDirectory());
  if (cmSystemTools::GetErrorOccuredFlag()) {
    return -1;
  }
  return 0;
}